

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

int av1_handle_intra_y_mode
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,uint ref_frame_cost,PICK_MODE_CONTEXT *ctx,RD_STATS *rd_stats_y,int64_t best_rd,
              int *mode_cost_y,int64_t *rd_y,int64_t *best_model_rd,int64_t *top_intra_model_rd)

{
  byte bVar1;
  PREDICTION_MODE PVar2;
  MB_MODE_INFO *pMVar3;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *pMVar4;
  TX_SIZE tx_size;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int64_t iVar9;
  undefined7 in_register_00000009;
  ulong uVar10;
  ulong uVar11;
  int mode_cost;
  ulong uVar12;
  long lVar13;
  RD_STATS *pRVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  
  pMVar3 = (x->e_mbd).left_mbmi;
  mbmi = *(x->e_mbd).mi;
  bVar1 = mbmi->mode;
  uVar15 = (ulong)bVar1;
  uVar10 = CONCAT71(in_register_00000009,bsize) & 0xffffffff;
  pMVar4 = (x->e_mbd).above_mbmi;
  if (pMVar4 == (MB_MODE_INFO *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)pMVar4->skip_txfm;
  }
  if (pMVar3 == (MB_MODE_INFO *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = (ulong)pMVar3->skip_txfm;
  }
  mode_cost = ref_frame_cost + (x->mode_costs).mbmode_cost[""[uVar10]][uVar15];
  lVar13 = uVar12 + uVar11;
  iVar5 = av1_get_intra_cost_penalty
                    ((cpi->common).quant_params.base_qindex,(cpi->common).quant_params.y_dc_delta_q,
                     ((cpi->common).seq_params)->bit_depth);
  iVar6 = mode_cost;
  if ((uVar15 != 0) && (bVar1 != 0xc)) {
    iVar6 = iVar5 + mode_cost;
  }
  iVar5 = (x->mode_costs).skip_txfm_cost[lVar13][0];
  iVar7 = (x->mode_costs).skip_txfm_cost[lVar13][1];
  if (iVar5 < iVar7) {
    iVar7 = iVar5;
  }
  if (best_rd < (long)x->rdmult * (long)(iVar7 + iVar6) + 0x100 >> 9) goto LAB_00248240;
  if (((BLOCK_8X4 < bsize) && (0xf7 < (byte)(bVar1 - 9))) &&
     ((cpi->oxcf).intra_mode_cfg.enable_angle_delta == true)) {
    lVar8 = (long)(cpi->sf).intra_sf.intra_pruning_with_hog;
    if ((lVar8 != 0) && (intra_search_state->dir_mode_skip_mask_ready == 0)) {
      prune_intra_mode_with_hog
                (x,bsize,((cpi->common).seq_params)->sb_size,*(float *)(&DAT_0050debc + lVar8 * 4),
                 intra_search_state->directional_mode_skip_mask,0);
      intra_search_state->dir_mode_skip_mask_ready = 1;
    }
    if (intra_search_state->directional_mode_skip_mask[uVar15] != '\0') {
      return 0;
    }
  }
  tx_size = '\x03';
  if (((uint)CONCAT71(in_register_00000009,bsize) & 0xfffffffc) != 0xc) {
    tx_size = ""[uVar10];
  }
  iVar5 = 1;
  iVar9 = intra_model_rd(&cpi->common,x,0,bsize,tx_size,1);
  iVar6 = (cpi->sf).intra_sf.top_intra_model_count_allowed;
  if ((cpi->sf).intra_sf.adapt_top_model_rd_count_using_neighbors == 0) {
    iVar7 = iVar6 + -1;
  }
  else {
    PVar2 = (*(x->e_mbd).mi)->mode;
    if ((x->e_mbd).left_available == true) {
      bVar16 = ((x->e_mbd).left_mbmi)->mode != PVar2;
    }
    else {
      bVar16 = false;
    }
    if ((x->e_mbd).up_available == true) {
      bVar17 = ((x->e_mbd).above_mbmi)->mode != PVar2;
    }
    else {
      bVar17 = false;
    }
    iVar7 = iVar6 + -1;
    if (x->qindex < 0x80) {
      if ((bool)(bVar16 | bVar17)) {
LAB_00248398:
        iVar7 = 2;
        if (2 < iVar6) {
          iVar7 = iVar6;
        }
        iVar7 = iVar7 + -2;
      }
    }
    else if ((bool)(bVar16 & bVar17)) goto LAB_00248398;
  }
  iVar6 = prune_intra_y_mode(iVar9,best_model_rd,top_intra_model_rd,
                             (cpi->sf).intra_sf.top_intra_model_count_allowed,iVar7);
  if (iVar6 != 0) {
    return 0;
  }
  rd_stats_y->rate = 0;
  rd_stats_y->zero_rate = 0;
  rd_stats_y->dist = 0;
  rd_stats_y->rdcost = 0;
  rd_stats_y->sse = 0;
  rd_stats_y->skip_txfm = '\x01';
  av1_pick_uniform_tx_size_type_yrd(cpi,x,rd_stats_y,bsize,best_rd);
  if (((uVar15 == 0) && (bsize != BLOCK_INVALID)) &&
     ((((cpi->common).seq_params)->enable_filter_intra != '\0' &&
      (((0x1f07ffUL >> ((ulong)bsize & 0x3f) & 1) != 0 &&
       ((0x2f0bffUL >> ((ulong)bsize & 0x3f) & 1) != 0)))))) {
    iVar6 = rd_stats_y->rate;
    if (iVar6 == 0x7fffffff) {
      bVar16 = 0 < (cpi->sf).intra_sf.skip_filter_intra_in_inter_frames;
      iVar9 = 0x7fffffffffffffff;
    }
    else {
      (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
      iVar7 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,mode_cost,iVar5);
      iVar9 = rd_stats_y->dist * 0x80 + ((long)x->rdmult * (long)(iVar7 + iVar6) + 0x100 >> 9);
      bVar16 = best_rd < iVar9 / 2;
    }
    if (!bVar16) {
      iVar5 = mode_cost;
      handle_filter_intra_mode(cpi,x,bsize,ctx,rd_stats_y,mode_cost,best_rd,iVar9);
    }
  }
  if (rd_stats_y->rate == 0x7fffffff) {
    return 0;
  }
  iVar6 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,mode_cost,iVar5);
  *mode_cost_y = iVar6;
  pRVar14 = (RD_STATS *)((x->mode_costs).skip_txfm_cost[lVar13] + 1);
  if (rd_stats_y->skip_txfm == '\0') {
    pRVar14 = rd_stats_y;
  }
  lVar13 = rd_stats_y->dist * 0x80 +
           ((long)x->rdmult * ((long)iVar6 + (long)pRVar14->rate) + 0x100 >> 9);
  *rd_y = lVar13;
  if (0x3ffffffffffffffe < best_rd) {
    return 1;
  }
  if (lVar13 <= (best_rd >> 2) + best_rd) {
    return 1;
  }
LAB_00248240:
  intra_search_state->skip_intra_modes = 1;
  return 0;
}

Assistant:

int av1_handle_intra_y_mode(IntraModeSearchState *intra_search_state,
                            const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, unsigned int ref_frame_cost,
                            const PICK_MODE_CONTEXT *ctx, RD_STATS *rd_stats_y,
                            int64_t best_rd, int *mode_cost_y, int64_t *rd_y,
                            int64_t *best_model_rd,
                            int64_t top_intra_model_rd[]) {
  const AV1_COMMON *cm = &cpi->common;
  const INTRA_MODE_SPEED_FEATURES *const intra_sf = &cpi->sf.intra_sf;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->ref_frame[0] == INTRA_FRAME);
  const PREDICTION_MODE mode = mbmi->mode;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int mode_cost =
      mode_costs->mbmode_cost[size_group_lookup[bsize]][mode] + ref_frame_cost;
  const int skip_ctx = av1_get_skip_txfm_context(xd);

  int known_rate = mode_cost;
  const int intra_cost_penalty = av1_get_intra_cost_penalty(
      cm->quant_params.base_qindex, cm->quant_params.y_dc_delta_q,
      cm->seq_params->bit_depth);

  if (mode != DC_PRED && mode != PAETH_PRED) known_rate += intra_cost_penalty;
  known_rate += AOMMIN(mode_costs->skip_txfm_cost[skip_ctx][0],
                       mode_costs->skip_txfm_cost[skip_ctx][1]);
  const int64_t known_rd = RDCOST(x->rdmult, known_rate, 0);
  if (known_rd > best_rd) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }

  const int is_directional_mode = av1_is_directional_mode(mode);
  if (is_directional_mode && av1_use_angle_delta(bsize) &&
      cpi->oxcf.intra_mode_cfg.enable_angle_delta) {
    if (intra_sf->intra_pruning_with_hog &&
        !intra_search_state->dir_mode_skip_mask_ready) {
      const float thresh[4] = { -1.2f, 0.0f, 0.0f, 1.2f };
      const int is_chroma = 0;
      prune_intra_mode_with_hog(x, bsize, cm->seq_params->sb_size,
                                thresh[intra_sf->intra_pruning_with_hog - 1],
                                intra_search_state->directional_mode_skip_mask,
                                is_chroma);
      intra_search_state->dir_mode_skip_mask_ready = 1;
    }
    if (intra_search_state->directional_mode_skip_mask[mode]) return 0;
  }
  const TX_SIZE tx_size = AOMMIN(TX_32X32, max_txsize_lookup[bsize]);
  const int64_t this_model_rd =
      intra_model_rd(&cpi->common, x, 0, bsize, tx_size, /*use_hadamard=*/1);

  const int model_rd_index_for_pruning =
      get_model_rd_index_for_pruning(x, intra_sf);

  if (prune_intra_y_mode(this_model_rd, best_model_rd, top_intra_model_rd,
                         intra_sf->top_intra_model_count_allowed,
                         model_rd_index_for_pruning))
    return 0;
  av1_init_rd_stats(rd_stats_y);
  av1_pick_uniform_tx_size_type_yrd(cpi, x, rd_stats_y, bsize, best_rd);

  // Pick filter intra modes.
  if (mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
    int try_filter_intra = 1;
    int64_t best_rd_so_far = INT64_MAX;
    if (rd_stats_y->rate != INT_MAX) {
      // best_rd_so_far is the rdcost of DC_PRED without using filter_intra.
      // Later, in filter intra search, best_rd_so_far is used for comparison.
      mbmi->filter_intra_mode_info.use_filter_intra = 0;
      const int tmp_rate =
          rd_stats_y->rate +
          intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
      best_rd_so_far = RDCOST(x->rdmult, tmp_rate, rd_stats_y->dist);
      try_filter_intra = (best_rd_so_far / 2) <= best_rd;
    } else if (intra_sf->skip_filter_intra_in_inter_frames >= 1) {
      // As rd cost of luma intra dc mode is more than best_rd (i.e.,
      // rd_stats_y->rate = INT_MAX), skip the evaluation of filter intra modes.
      try_filter_intra = 0;
    }

    if (try_filter_intra) {
      handle_filter_intra_mode(cpi, x, bsize, ctx, rd_stats_y, mode_cost,
                               best_rd, best_rd_so_far);
    }
  }

  if (rd_stats_y->rate == INT_MAX) return 0;

  *mode_cost_y = intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
  const int rate_y = rd_stats_y->skip_txfm
                         ? mode_costs->skip_txfm_cost[skip_ctx][1]
                         : rd_stats_y->rate;
  *rd_y = RDCOST(x->rdmult, rate_y + *mode_cost_y, rd_stats_y->dist);
  if (best_rd < (INT64_MAX / 2) && *rd_y > (best_rd + (best_rd >> 2))) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }

  return 1;
}